

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O3

int X509_REQ_add1_attr_by_txt(X509_REQ *req,char *attrname,int type,uchar *bytes,int len)

{
  int iVar1;
  X509_ATTRIBUTE *a;
  
  a = X509_ATTRIBUTE_create_by_txt((X509_ATTRIBUTE **)0x0,attrname,type,bytes,len);
  if ((a != (X509_ATTRIBUTE *)0x0) &&
     (iVar1 = X509_REQ_add0_attr((X509_REQ *)req,(X509_ATTRIBUTE *)a), iVar1 != 0)) {
    return 1;
  }
  X509_ATTRIBUTE_free(a);
  return 0;
}

Assistant:

int X509_REQ_add1_attr_by_txt(X509_REQ *req, const char *attrname, int attrtype,
                              const unsigned char *data, int len) {
  X509_ATTRIBUTE *attr =
      X509_ATTRIBUTE_create_by_txt(NULL, attrname, attrtype, data, len);
  if (attr == NULL || !X509_REQ_add0_attr(req, attr)) {
    X509_ATTRIBUTE_free(attr);
    return 0;
  }

  return 1;
}